

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall TagConfiguration::TagConfiguration(TagConfiguration *this,Configuration *cfg)

{
  QLatin1String str_00;
  QLatin1String str_01;
  QLatin1String str_02;
  QLatin1String str_03;
  QLatin1String str_04;
  QLatin1String latin1;
  QLatin1String latin1_00;
  QLatin1String latin1_01;
  bool bVar1;
  TagVecOfTags *this_00;
  const_iterator pair_00;
  long in_RSI;
  tag_t<cfgfile::qstring_trait_t> *in_RDI;
  shared_ptr<TagVecOfTags> p;
  Pair *pair;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Configuration::Pair,_std::allocator<Configuration::Pair>_> *__range1_1;
  QString *str;
  const_iterator __end1;
  const_iterator __begin1;
  vector<QString,_std::allocator<QString>_> *__range1;
  TagVecOfTags *in_stack_fffffffffffffdc8;
  tag_vector_of_tags_t<TagVecOfTags,_cfgfile::qstring_trait_t> *in_stack_fffffffffffffdd0;
  tag_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffdd8;
  tag_vector_of_tags_t<TagVecOfTags,_cfgfile::qstring_trait_t> *in_stack_fffffffffffffde0;
  constraint_one_of_t<QString> *this_01;
  tag_t<cfgfile::qstring_trait_t> *this_02;
  bool *pbVar2;
  tag_t<cfgfile::qstring_trait_t> *ptVar3;
  reference local_1a8;
  Pair *local_1a0;
  __normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_> local_178;
  pointer local_170;
  QString *in_stack_ffffffffffffff38;
  tag_scalar_t<QString,_cfgfile::qstring_trait_t> *in_stack_ffffffffffffff40;
  
  QLatin1String::QLatin1String
            ((QLatin1String *)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
  str_00.m_data = (char *)in_stack_fffffffffffffde0;
  str_00.m_size = (qsizetype)in_stack_fffffffffffffdd8;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t
            ((qstring_wrapper_t *)in_stack_fffffffffffffdd0,str_00);
  cfgfile::tag_no_value_t<cfgfile::qstring_trait_t>::tag_no_value_t
            ((tag_no_value_t<cfgfile::qstring_trait_t> *)in_stack_fffffffffffffde0,
             (string_t *)in_stack_fffffffffffffdd8,SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x38,0)
            );
  cfgfile::qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x122e1d);
  in_RDI->_vptr_tag_t = (_func_int **)&PTR__TagConfiguration_00139778;
  ptVar3 = in_RDI + 1;
  QLatin1String::QLatin1String
            ((QLatin1String *)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
  str_01.m_data = (char *)in_stack_fffffffffffffde0;
  str_01.m_size = (qsizetype)in_stack_fffffffffffffdd8;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t
            ((qstring_wrapper_t *)in_stack_fffffffffffffdd0,str_01);
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::tag_scalar_t
            ((tag_scalar_t<QString,_cfgfile::qstring_trait_t> *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8,(string_t *)in_stack_fffffffffffffdd0,
             SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
  cfgfile::qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x122e97);
  pbVar2 = &in_RDI[2].m_is_mandatory;
  cfgfile::constraint_one_of_t<QString>::constraint_one_of_t
            ((constraint_one_of_t<QString> *)in_stack_fffffffffffffdd0);
  this_02 = in_RDI + 3;
  QLatin1String::QLatin1String
            ((QLatin1String *)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
  str_02.m_data = (char *)in_stack_fffffffffffffde0;
  str_02.m_size = (qsizetype)in_stack_fffffffffffffdd8;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t
            ((qstring_wrapper_t *)in_stack_fffffffffffffdd0,str_02);
  cfgfile::tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t>::tag_scalar_vector_t
            ((tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8,(string_t *)in_stack_fffffffffffffdd0,
             SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
  cfgfile::qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x122f1d);
  cfgfile::constraint_min_max_t<int>::constraint_min_max_t
            ((constraint_min_max_t<int> *)in_stack_fffffffffffffde0,(int *)in_stack_fffffffffffffdd8
             ,(int *)in_stack_fffffffffffffdd0);
  QLatin1String::QLatin1String
            ((QLatin1String *)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
  str_03.m_data = (char *)in_stack_fffffffffffffde0;
  str_03.m_size = (qsizetype)in_stack_fffffffffffffdd8;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t
            ((qstring_wrapper_t *)in_stack_fffffffffffffdd0,str_03);
  cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::tag_scalar_t
            ((tag_scalar_t<int,_cfgfile::qstring_trait_t> *)in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8,(string_t *)in_stack_fffffffffffffdd0,
             SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
  cfgfile::qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x122fc9);
  QLatin1String::QLatin1String
            ((QLatin1String *)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
  str_04.m_data = (char *)in_stack_fffffffffffffde0;
  str_04.m_size = (qsizetype)in_stack_fffffffffffffdd8;
  cfgfile::qstring_wrapper_t::qstring_wrapper_t
            ((qstring_wrapper_t *)in_stack_fffffffffffffdd0,str_04);
  cfgfile::tag_vector_of_tags_t<TagVecOfTags,_cfgfile::qstring_trait_t>::tag_vector_of_tags_t
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             (string_t *)in_stack_fffffffffffffdd0,SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0)
            );
  cfgfile::qstring_wrapper_t::~qstring_wrapper_t((qstring_wrapper_t *)0x123037);
  QLatin1String::QLatin1String
            ((QLatin1String *)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
  latin1.m_data = (char *)ptVar3;
  latin1.m_size = (qsizetype)pbVar2;
  QString::QString((QString *)this_02,latin1);
  cfgfile::constraint_one_of_t<QString>::add_value
            ((constraint_one_of_t<QString> *)in_stack_fffffffffffffde0,
             (QString *)in_stack_fffffffffffffdd8);
  QString::~QString((QString *)0x12309b);
  QLatin1String::QLatin1String
            ((QLatin1String *)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
  latin1_00.m_data = (char *)ptVar3;
  latin1_00.m_size = (qsizetype)pbVar2;
  QString::QString((QString *)this_02,latin1_00);
  cfgfile::constraint_one_of_t<QString>::add_value
            ((constraint_one_of_t<QString> *)in_stack_fffffffffffffde0,
             (QString *)in_stack_fffffffffffffdd8);
  QString::~QString((QString *)0x1230ff);
  this_01 = (constraint_one_of_t<QString> *)&in_RDI[2].m_is_mandatory;
  QLatin1String::QLatin1String((QLatin1String *)this_01,(char *)in_stack_fffffffffffffdd8);
  latin1_01.m_data = (char *)ptVar3;
  latin1_01.m_size = (qsizetype)pbVar2;
  QString::QString((QString *)this_02,latin1_01);
  cfgfile::constraint_one_of_t<QString>::add_value(this_01,(QString *)in_stack_fffffffffffffdd8);
  QString::~QString((QString *)0x123163);
  cfgfile::tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t>::set_constraint
            ((tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *)(in_RDI + 3),
             (constraint_t<QString> *)&in_RDI[2].m_is_mandatory);
  cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::set_constraint
            ((tag_scalar_t<int,_cfgfile::qstring_trait_t> *)
             &in_RDI[4].m_child_tags.
              super__Vector_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,
             (constraint_t<int> *)&in_RDI[4].m_is_mandatory);
  cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::set_value
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_170 = (pointer)(in_RSI + 0x18);
  local_178._M_current =
       (QString *)
       std::vector<QString,_std::allocator<QString>_>::begin
                 ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffdc8);
  std::vector<QString,_std::allocator<QString>_>::end
            ((vector<QString,_std::allocator<QString>_> *)in_stack_fffffffffffffdc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>
                        *)in_stack_fffffffffffffdc8);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator*(&local_178);
    cfgfile::tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t>::set_value
              ((tag_scalar_vector_t<QString,_cfgfile::qstring_trait_t> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    __gnu_cxx::__normal_iterator<const_QString_*,_std::vector<QString,_std::allocator<QString>_>_>::
    operator++(&local_178);
  }
  cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::set_value
            ((tag_scalar_t<int,_cfgfile::qstring_trait_t> *)in_stack_ffffffffffffff40,
             (int *)in_stack_ffffffffffffff38);
  this_00 = (TagVecOfTags *)(in_RSI + 0x38);
  pair_00 = std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>::begin
                      ((vector<Configuration::Pair,_std::allocator<Configuration::Pair>_> *)
                       in_stack_fffffffffffffdc8);
  local_1a0 = (Pair *)std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>::end
                                ((vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>
                                  *)in_stack_fffffffffffffdc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Configuration::Pair_*,_std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<const_Configuration::Pair_*,_std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>_>
                        *)in_stack_fffffffffffffdc8);
    if (!bVar1) break;
    local_1a8 = __gnu_cxx::
                __normal_iterator<const_Configuration::Pair_*,_std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>_>
                ::operator*((__normal_iterator<const_Configuration::Pair_*,_std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>_>
                             *)&stack0xfffffffffffffe68);
    operator_new(0x138);
    TagVecOfTags::TagVecOfTags(this_00,pair_00._M_current);
    std::shared_ptr<TagVecOfTags>::shared_ptr<TagVecOfTags,void>
              ((shared_ptr<TagVecOfTags> *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffdc8 = (TagVecOfTags *)&in_RDI[5].m_parent;
    in_stack_fffffffffffffdd0 =
         (tag_vector_of_tags_t<TagVecOfTags,_cfgfile::qstring_trait_t> *)&stack0xfffffffffffffe38;
    std::shared_ptr<TagVecOfTags>::shared_ptr
              ((shared_ptr<TagVecOfTags> *)in_stack_fffffffffffffdd0,
               (shared_ptr<TagVecOfTags> *)in_stack_fffffffffffffdc8);
    cfgfile::tag_vector_of_tags_t<TagVecOfTags,_cfgfile::qstring_trait_t>::set_value
              (in_stack_fffffffffffffdd0,(ptr_to_tag_t *)in_stack_fffffffffffffdc8);
    std::shared_ptr<TagVecOfTags>::~shared_ptr((shared_ptr<TagVecOfTags> *)0x12353a);
    std::shared_ptr<TagVecOfTags>::~shared_ptr((shared_ptr<TagVecOfTags> *)0x123547);
    __gnu_cxx::
    __normal_iterator<const_Configuration::Pair_*,_std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>_>
    ::operator++((__normal_iterator<const_Configuration::Pair_*,_std::vector<Configuration::Pair,_std::allocator<Configuration::Pair>_>_>
                  *)&stack0xfffffffffffffe68);
  }
  cfgfile::tag_t<cfgfile::qstring_trait_t>::set_defined(in_RDI,true);
  return;
}

Assistant:

TagConfiguration::TagConfiguration( const Configuration & cfg )
	:	cfgfile::tag_no_value_t< cfgfile::qstring_trait_t >( QLatin1String( "cfg" ), true )
	,	m_stringValue( *this, QLatin1String( "stringValue" ), true )
	,	m_listOfStringValues( *this, QLatin1String( "listOfStringValues" ), true )
	,	m_constriantForIntValue( 0, 100 )
	,	m_intValue( *this, QLatin1String( "intValue" ), true )
	,	m_vecOfTags( *this, QLatin1String( "vecOfTags" ), true )
{
	m_constraintForListOfStringValues.add_value( QLatin1String( "str1" ) );
	m_constraintForListOfStringValues.add_value( QLatin1String( "str2" ) );
	m_constraintForListOfStringValues.add_value( QLatin1String( "str3" ) );

	m_listOfStringValues.set_constraint( &m_constraintForListOfStringValues );
	m_intValue.set_constraint( &m_constriantForIntValue );

	m_stringValue.set_value( cfg.m_stringValue );

	for( const auto & str : cfg.m_listOfStringValues )
		m_listOfStringValues.set_value( str );

	m_intValue.set_value( cfg.m_intValue );

	for( const auto & pair : cfg.m_vectorOfTags )
	{
		std::shared_ptr< TagVecOfTags > p( new TagVecOfTags( pair ) );
		m_vecOfTags.set_value( p );
	}

	set_defined();
}